

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.cpp
# Opt level: O3

istream * operator>>(istream *is,vec4f *v)

{
  istream *piVar1;
  
  piVar1 = std::istream::_M_extract<float>((float *)is);
  piVar1 = std::istream::_M_extract<float>((float *)piVar1);
  piVar1 = std::istream::_M_extract<float>((float *)piVar1);
  piVar1 = std::istream::_M_extract<float>((float *)piVar1);
  return piVar1;
}

Assistant:

std::istream& operator >> (std::istream& is, vec4f& v) {
	return is >> v.x >> v.y >> v.z >> v.w;
}